

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::python::Generator::FieldReferencingExpression_abi_cxx11_
          (string *__return_storage_ptr__,Generator *this,Descriptor *containing_type,
          FieldDescriptor *field,string_view python_dict_name)

{
  ushort *puVar1;
  string *psVar2;
  string_view name;
  Nullable<const_char_*> failure_msg;
  LogMessage *pLVar3;
  Arg *a2;
  string_view v;
  string_view v_00;
  string_view format;
  LogMessage local_e0 [3];
  string local_b0;
  Arg local_90;
  Arg local_60;
  
  a2 = (Arg *)python_dict_name._M_str;
  local_e0[0]._0_8_ = field->file_;
  failure_msg = absl::lts_20250127::log_internal::
                Check_EQImpl<google::protobuf::FileDescriptor_const*,google::protobuf::FileDescriptor_const*>
                          ((FileDescriptor **)local_e0,&this->file_,"field.file() == file_");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    if (containing_type == (Descriptor *)0x0) {
      name._M_str = (char *)a2;
      name._M_len = 0xb63425;
      ResolveKeyword_abi_cxx11_(name);
    }
    else {
      ModuleLevelDescriptorName<google::protobuf::Descriptor>(&local_b0,this,containing_type);
      local_e0[0]._0_8_ = local_b0._M_string_length;
      local_e0[0].data_._M_t.
      super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
      ._M_t.
      super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
      .super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>.
      _M_head_impl = (__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                      )(__uniq_ptr_data<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>,_true,_true>
                        )local_b0._M_dataplus._M_p;
      puVar1 = (ushort *)(field->all_names_).payload_;
      local_90.piece_._M_len = (size_t)*puVar1;
      local_90.piece_._M_str = (char *)((long)puVar1 + ~local_90.piece_._M_len);
      format._M_str = (char *)local_e0;
      format._M_len = (size_t)"$0.$1[\'$2\']";
      local_60.piece_._M_len = python_dict_name._M_len;
      local_60.piece_._M_str = (char *)a2;
      absl::lts_20250127::Substitute_abi_cxx11_
                (__return_storage_ptr__,(lts_20250127 *)&DAT_0000000b,format,&local_60,&local_90,a2)
      ;
      std::__cxx11::string::~string((string *)&local_b0);
    }
    return __return_storage_ptr__;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_e0,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/python/generator.cc"
             ,0x448,failure_msg);
  psVar2 = field->file_->name_;
  v._M_str = (psVar2->_M_dataplus)._M_p;
  v._M_len = psVar2->_M_string_length;
  pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<(local_e0,v);
  pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar3,(char (*) [6])" vs. ");
  psVar2 = this->file_->name_;
  v_00._M_str = (psVar2->_M_dataplus)._M_p;
  v_00._M_len = psVar2->_M_string_length;
  absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar3,v_00);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_e0);
}

Assistant:

std::string Generator::FieldReferencingExpression(
    const Descriptor* containing_type, const FieldDescriptor& field,
    absl::string_view python_dict_name) const {
  // We should only ever be looking up fields in the current file.
  // The only things we refer to from other files are message descriptors.
  ABSL_CHECK_EQ(field.file(), file_)
      << field.file()->name() << " vs. " << file_->name();
  if (!containing_type) {
    return ResolveKeyword(field.name());
  }
  return absl::Substitute("$0.$1['$2']",
                          ModuleLevelDescriptorName(*containing_type),
                          python_dict_name, field.name());
}